

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDD.h
# Opt level: O3

void __thiscall
chrono::fea::ChNodeFEAxyzDD::LoadableGetStateBlock_x
          (ChNodeFEAxyzDD *this,int block_offset,ChState *mDD)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  Index index_2;
  Index index;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (block_offset < 0) goto LAB_0065522b;
  lVar3 = (mDD->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3;
  if (lVar3 < block_offset) goto LAB_0065522b;
  pdVar2 = (mDD->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  pdVar1 = pdVar2 + block_offset;
  uVar4 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 != 0) goto LAB_0065511e;
  }
  else {
LAB_0065511e:
    uVar6 = 0;
    do {
      pdVar1[uVar6] =
           *(double *)
            (&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase.field_0x20 +
            uVar6 * 8);
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar4 < 3) {
    do {
      pdVar1[uVar4] =
           *(double *)
            (&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase.field_0x20 +
            uVar4 * 8);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  uVar4 = (ulong)(uint)block_offset;
  if (lVar3 < (long)(uVar4 + 3)) goto LAB_0065522b;
  pdVar1 = pdVar2 + uVar4 + 3;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar6 = (ulong)uVar5;
    }
    if (uVar5 != 0) goto LAB_0065518d;
  }
  else {
LAB_0065518d:
    uVar7 = 0;
    do {
      pdVar1[uVar7] = *(double *)((long)(&(this->super_ChNodeFEAxyzD).D_dt + -1) + uVar7 * 8);
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = *(double *)((long)(&(this->super_ChNodeFEAxyzD).D_dt + -1) + uVar6 * 8);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  if (lVar3 < (long)(uVar4 + 6)) {
LAB_0065522b:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar2 = pdVar2 + uVar4 + 6;
  uVar4 = 3;
  if (((ulong)pdVar2 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 == 0) goto LAB_0065520c;
  }
  uVar6 = 0;
  do {
    pdVar2[uVar6] = *(double *)((long)(&this->DD_dt + -1) + uVar6 * 8);
    uVar6 = uVar6 + 1;
  } while (uVar4 != uVar6);
LAB_0065520c:
  if (uVar4 < 3) {
    do {
      pdVar2[uVar4] = *(double *)((long)(&this->DD_dt + -1) + uVar4 * 8);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  return;
}

Assistant:

virtual void LoadableGetStateBlock_x(int block_offset, ChState& mDD) override {
        mDD.segment(block_offset + 0, 3) = pos.eigen();
        mDD.segment(block_offset + 3, 3) = D.eigen();
        mDD.segment(block_offset + 6, 3) = DD.eigen();
    }